

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O2

void __thiscall QPDFWriter::closeObject(QPDFWriter *this,int objid)

{
  Count *pCVar1;
  string *psVar2;
  size_type sVar3;
  NewObject *this_00;
  size_type *psVar4;
  qpdf_offset_t qVar5;
  string_view str;
  string_view str_00;
  
  str._M_str = "\nendobj\n";
  str._M_len = 8;
  writeString(this,str);
  str_00._M_str = "\n";
  str_00._M_len = 1;
  writeStringQDF(this,str_00);
  this_00 = ObjTable<QPDFWriter::NewObject>::operator[]
                      (&(((this->m).
                          super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                         )->new_obj).super_ObjTable<QPDFWriter::NewObject>,objid);
  pCVar1 = ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           pipeline;
  psVar2 = pCVar1->str;
  psVar4 = (size_type *)&pCVar1->count;
  if (psVar2 != (string *)0x0) {
    psVar4 = &psVar2->_M_string_length;
  }
  sVar3 = *psVar4;
  qVar5 = QPDFXRefEntry::getOffset(&this_00->xref);
  this_00->length = sVar3 - qVar5;
  return;
}

Assistant:

void
QPDFWriter::closeObject(int objid)
{
    // Write a newline before endobj as it makes the file easier to repair.
    writeString("\nendobj\n");
    writeStringQDF("\n");
    auto& new_obj = m->new_obj[objid];
    new_obj.length = m->pipeline->getCount() - new_obj.xref.getOffset();
}